

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCrypto_openssl.cc
# Opt level: O1

void __thiscall QPDFCrypto_openssl::SHA2_init(QPDFCrypto_openssl *this,int bits)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  logic_error *this_00;
  undefined8 *puVar4;
  uint uVar5;
  ulong uVar6;
  uint __val;
  uint __len;
  size_type __dnew;
  string __str;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 **local_70;
  undefined8 *local_68;
  undefined8 *local_60 [2];
  undefined8 **local_50;
  long local_48;
  undefined8 *local_40 [2];
  
  if (SHA2_init(int)::md == '\0') {
    iVar3 = __cxa_guard_acquire(&SHA2_init(int)::md);
    if (iVar3 != 0) {
      SHA2_init::md = (EVP_MD *)EVP_sha512();
      __cxa_guard_release(&SHA2_init(int)::md);
    }
  }
  if (bits == 0x100) {
    SHA2_init::md = (EVP_MD *)EVP_sha256();
LAB_002628dc:
    this->sha2_bits = (long)bits;
    iVar3 = EVP_MD_CTX_reset(this->md_ctx);
    check_openssl(iVar3);
    iVar3 = EVP_DigestInit_ex((EVP_MD_CTX *)this->md_ctx,(EVP_MD *)SHA2_init::md,(ENGINE *)0x0);
    check_openssl(iVar3);
    return;
  }
  if (bits == 0x180) {
    SHA2_init::md = (EVP_MD *)EVP_sha384();
    goto LAB_002628dc;
  }
  if (bits == 0x200) {
    SHA2_init::md = (EVP_MD *)EVP_sha512();
    goto LAB_002628dc;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  local_90 = (undefined8 *)0x18;
  local_70 = local_60;
  local_70 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_70,(ulong)&local_90);
  local_60[0] = local_90;
  *local_70 = (undefined8 *)0x726f707075736e75;
  local_70[1] = (undefined8 *)0x2079656b20646574;
  local_70[2] = (undefined8 *)0x203a6874676e656c;
  local_68 = local_90;
  *(char *)((long)local_70 + (long)local_90) = '\0';
  __val = -bits;
  if (0 < bits) {
    __val = bits;
  }
  __len = 1;
  if (9 < __val) {
    uVar6 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_00262a13;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_00262a13;
      }
      if (uVar5 < 10000) goto LAB_00262a13;
      uVar6 = uVar6 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar5);
    __len = __len + 1;
  }
LAB_00262a13:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)(bits >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)bits >> 0x1f) + (long)local_50),__len,__val);
  puVar4 = (undefined8 *)0xf;
  if (local_70 != local_60) {
    puVar4 = local_60[0];
  }
  if (puVar4 < (undefined8 *)(local_48 + (long)local_68)) {
    puVar4 = (undefined8 *)0xf;
    if (local_50 != local_40) {
      puVar4 = local_40[0];
    }
    if ((undefined8 *)(local_48 + (long)local_68) <= puVar4) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_70);
      goto LAB_00262aa1;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50);
LAB_00262aa1:
  local_90 = (undefined8 *)*puVar4;
  puVar1 = puVar4 + 2;
  if (local_90 == puVar1) {
    local_80 = *puVar1;
    uStack_78 = puVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar1;
  }
  local_88 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::logic_error::logic_error(this_00,(string *)&local_90);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
QPDFCrypto_openssl::SHA2_init(int bits)
{
    static const EVP_MD* md = EVP_sha512();
    switch (bits) {
    case 256:
        md = EVP_sha256();
        break;
    case 384:
        md = EVP_sha384();
        break;
    case 512:
        md = EVP_sha512();
        break;
    default:
        bad_bits(bits);
        return;
    }
    sha2_bits = static_cast<size_t>(bits);
    check_openssl(EVP_MD_CTX_reset(md_ctx));
    check_openssl(EVP_DigestInit_ex(md_ctx, md, nullptr));
}